

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode parseurl_and_replace(char *url,CURLU *u,uint flags)

{
  undefined1 local_78 [8];
  CURLU tmpurl;
  CURLUcode result;
  uint flags_local;
  CURLU *u_local;
  char *url_local;
  
  tmpurl.portnum._4_4_ = flags;
  memset(local_78,0,0x58);
  tmpurl.portnum._0_4_ = parseurl(url,(CURLU *)local_78,tmpurl.portnum._4_4_);
  if ((CURLUcode)tmpurl.portnum == CURLUE_OK) {
    free_urlhandle(u);
    memcpy(u,local_78,0x58);
  }
  return (CURLUcode)tmpurl.portnum;
}

Assistant:

static CURLUcode parseurl_and_replace(const char *url, CURLU *u,
                                      unsigned int flags)
{
  CURLUcode result;
  CURLU tmpurl;
  memset(&tmpurl, 0, sizeof(tmpurl));
  result = parseurl(url, &tmpurl, flags);
  if(!result) {
    free_urlhandle(u);
    *u = tmpurl;
  }
  return result;
}